

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visualinfo.c
# Opt level: O2

void PrintExtensions(char *s)

{
  char cVar1;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  char *__s;
  int iVar5;
  char t [80];
  char local_88 [79];
  undefined1 local_39;
  
  local_39 = 0;
  pcVar4 = s + 1;
  uVar3 = 0;
  __s = (char *)0x0;
  while( true ) {
    cVar1 = pcVar4[-1];
    iVar5 = (int)uVar3;
    lVar2 = (long)iVar5;
    if (cVar1 == '\0') break;
    uVar3 = lVar2 + 1;
    local_88[lVar2] = cVar1;
    if (cVar1 == ' ') {
      if (*pcVar4 == '\0') {
        local_88[lVar2] = '\0';
      }
      else {
        local_88[lVar2] = ',';
        __s = local_88 + lVar2 + 1;
        *__s = ' ';
        uVar3 = (ulong)(iVar5 + 2);
      }
    }
    if (0x4b < (int)uVar3) {
      local_88[uVar3 & 0xffffffff] = '\0';
      *__s = '\0';
      fprintf((FILE *)file,"    %s\n",local_88);
      __s = __s + 1;
      uVar3 = strlen(__s);
      strcpy(local_88,__s);
    }
    pcVar4 = pcVar4 + 1;
  }
  local_88[lVar2] = '\0';
  fprintf((FILE *)file,"    %s.\n",local_88);
  return;
}

Assistant:

void PrintExtensions (const char* s)
{
  char t[80];
  int i=0;
  char* p=0;

  t[79] = '\0';
  while (*s)
  {
    t[i++] = *s;
    if(*s == ' ')
    {
      if (*(s+1) != '\0') {
	t[i-1] = ',';
	t[i] = ' ';
	p = &t[i++];
      }
      else /* zoinks! last one terminated in a space! */
      {
	t[i-1] = '\0';
      }
    }
    if(i > 80 - 5)
    {
      *p = t[i] = '\0';
      fprintf(file, "    %s\n", t);
      p++;
      i = (int)strlen(p);
#if defined(_MSC_VER) && (_MSC_VER >= 1400)
      strcpy_s(t, sizeof(t), p);
#else
      strcpy(t, p);
#endif
    }
    s++;
  }
  t[i] = '\0';
  fprintf(file, "    %s.\n", t);
}